

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Registry.cpp
# Opt level: O3

void __thiscall
SoapySDR::Registry::Registry
          (Registry *this,string *name,FindFunction *find,MakeFunction *make,string *abi)

{
  pointer pcVar1;
  int iVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  *this_00;
  string *__k;
  mapped_type *this_01;
  mapped_type *this_02;
  long *plVar3;
  const_iterator cVar4;
  mapped_type *pmVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  long *plVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  FunctionsEntry entry;
  ulong *local_c8;
  undefined8 local_c0;
  ulong local_b8;
  undefined8 uStack_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  long lStack_90;
  FindFunction local_88;
  MakeFunction p_Stack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78 = &(this->_name).field_2;
  (this->_name)._M_dataplus._M_p = (pointer)local_78;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  this_00 = getLoaderResults_abi_cxx11_();
  __k = getModuleLoading_abi_cxx11_();
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::operator[](this_00,__k);
  this_02 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_01,name);
  iVar2 = std::__cxx11::string::compare((char *)abi);
  if (iVar2 == 0) {
    getFunctionTable_abi_cxx11_();
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
            ::find(&getFunctionTable[abi:cxx11]()::table_abi_cxx11_._M_t,name);
    if ((_Rb_tree_header *)cVar4._M_node ==
        &getFunctionTable[abi:cxx11]()::table_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      local_a0 = 0;
      local_98 = local_98 & 0xffffffffffffff00;
      local_a8 = &local_98;
      getModuleLoading_abi_cxx11_();
      std::__cxx11::string::_M_assign((string *)&local_a8);
      local_88 = *find;
      p_Stack_80 = *make;
      getFunctionTable_abi_cxx11_();
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
               ::operator[](&getFunctionTable[abi:cxx11]()::table_abi_cxx11_,name);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      pmVar5->find = local_88;
      pmVar5->make = p_Stack_80;
      std::__cxx11::string::_M_assign((string *)this);
      local_50._M_dataplus._M_p = (pointer)local_a8;
      if (local_a8 == &local_98) {
        return;
      }
    }
    else {
      std::operator+(&local_50,"duplicate entry for ",name);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar8 = plVar3 + 2;
      if ((long *)*plVar3 == plVar8) {
        local_60 = *plVar8;
        lStack_58 = plVar3[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar8;
        local_70 = (long *)*plVar3;
      }
      local_68 = plVar3[1];
      *plVar3 = (long)plVar8;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      getFunctionTable_abi_cxx11_();
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
               ::operator[](&getFunctionTable[abi:cxx11]()::table_abi_cxx11_,name);
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_70,(ulong)(pmVar5->modulePath)._M_dataplus._M_p);
      puVar7 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar7) {
        local_b8 = *puVar7;
        uStack_b0 = puVar6[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *puVar7;
        local_c8 = (ulong *)*puVar6;
      }
      local_c0 = puVar6[1];
      *puVar6 = puVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
      puVar7 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar7) {
        local_98 = *puVar7;
        lStack_90 = puVar6[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *puVar7;
        local_a8 = (ulong *)*puVar6;
      }
      local_a0 = puVar6[1];
      *puVar6 = puVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)this_02,(string *)&local_a8);
      if (local_a8 != &local_98) {
        operator_delete(local_a8);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return;
      }
    }
  }
  else {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_c8 = &local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar1,pcVar1 + name->_M_string_length);
    std::__cxx11::string::append((char *)&local_c8);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_c8,(ulong)(abi->_M_dataplus)._M_p);
    puVar7 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar7) {
      local_98 = *puVar7;
      lStack_90 = plVar3[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *puVar7;
      local_a8 = (ulong *)*plVar3;
    }
    local_a0 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)this_02,(string *)&local_a8);
    if (local_a8 != &local_98) {
      operator_delete(local_a8);
    }
    local_50._M_dataplus._M_p = (pointer)local_c8;
    if (local_c8 == &local_b8) {
      return;
    }
  }
  operator_delete(local_50._M_dataplus._M_p);
  return;
}

Assistant:

SoapySDR::Registry::Registry(const std::string &name, const FindFunction &find, const MakeFunction &make, const std::string &abi)
{
    //create an entry for the loader result
    std::string &errorMsg = getLoaderResults()[getModuleLoading()][name];

    //abi check
    if (abi != SOAPY_SDR_ABI_VERSION)
    {
        errorMsg = name + " failed ABI check: Library ABI=" SOAPY_SDR_ABI_VERSION ", Module ABI="+abi;
        return;
    }

    //duplicate check
    if (getFunctionTable().count(name) != 0)
    {
        errorMsg = "duplicate entry for " + name + " ("+getFunctionTable()[name].modulePath + ")";
        return;
    }

    //register functions
    FunctionsEntry entry;
    entry.modulePath = getModuleLoading();
    entry.find = find;
    entry.make = make;
    getFunctionTable()[name] = entry;
    _name = name;
}